

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath *
testing::internal::FilePath::GenerateUniqueFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,char *extension)

{
  int iVar1;
  int number;
  undefined1 local_d0 [8];
  StatStruct file_stat;
  
  (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pathname_).field_2;
  (__return_storage_ptr__->pathname_)._M_string_length = 0;
  (__return_storage_ptr__->pathname_).field_2._M_local_buf[0] = '\0';
  number = 0;
  file_stat.__glibc_reserved[2] = (__syscall_slong_t)extension;
  do {
    MakeFileName((FilePath *)local_d0,directory,base_name,number,
                 (char *)file_stat.__glibc_reserved[2]);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&__return_storage_ptr__->pathname_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
    if (local_d0 != (undefined1  [8])&file_stat.st_ino) {
      operator_delete((void *)local_d0,file_stat.st_ino + 1);
    }
    iVar1 = stat((__return_storage_ptr__->pathname_)._M_dataplus._M_p,(stat *)local_d0);
    number = number + 1;
  } while (iVar1 == 0);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::GenerateUniqueFileName(const FilePath& directory,
                                          const FilePath& base_name,
                                          const char* extension) {
  FilePath full_pathname;
  int number = 0;
  do {
    full_pathname.Set(MakeFileName(directory, base_name, number++, extension));
  } while (full_pathname.FileOrDirectoryExists());
  return full_pathname;
}